

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void temp_allocate_frame(TCGContext_conflict9 *s,TCGTemp *ts)

{
  TCGTemp *ts_local;
  TCGContext_conflict9 *s_local;
  
  s->current_frame_offset = s->current_frame_offset + 7U & 0xfffffffffffffff8;
  if (s->frame_end < s->current_frame_offset + 8) {
    fprintf(_stderr,"%s:%d: tcg fatal error\n",
            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
            ,0xb4b);
    abort();
  }
  ts->mem_offset = s->current_frame_offset;
  ts->mem_base = s->frame_temp;
  *(ulong *)ts = *(ulong *)ts & 0xffffffefffffffff | 0x1000000000;
  s->current_frame_offset = s->current_frame_offset + 8;
  return;
}

Assistant:

static void temp_allocate_frame(TCGContext *s, TCGTemp *ts)
{
#if !(defined(__sparc__) && TCG_TARGET_REG_BITS == 64)
    /* Sparc64 stack is accessed with offset of 2047 */
    s->current_frame_offset = (s->current_frame_offset +
                               (tcg_target_long)sizeof(tcg_target_long) - 1) &
        ~(sizeof(tcg_target_long) - 1);
#endif
    if (s->current_frame_offset + (tcg_target_long)sizeof(tcg_target_long) >
        s->frame_end) {
        tcg_abort();
    }
    ts->mem_offset = s->current_frame_offset;
    ts->mem_base = s->frame_temp;
    ts->mem_allocated = 1;
    s->current_frame_offset += sizeof(tcg_target_long);
}